

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringCacheTest.cpp
# Opt level: O3

void __thiscall
TEST_SimpleStringInternalCache_deallocatingMemoryThatWasntAllocatedWhileCacheWasInPlaceProducesWarning_Test
::
TEST_SimpleStringInternalCache_deallocatingMemoryThatWasntAllocatedWhileCacheWasInPlaceProducesWarning_Test
          (TEST_SimpleStringInternalCache_deallocatingMemoryThatWasntAllocatedWhileCacheWasInPlaceProducesWarning_Test
           *this)

{
  memset(this,0,0xa0);
  Utest::Utest((Utest *)this);
  (this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupSimpleStringInternalCache_00370b70;
  SimpleStringInternalCache::SimpleStringInternalCache
            (&(this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).cache);
  MemoryAccountant::MemoryAccountant
            (&(this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).accountant);
  ExecFunction::ExecFunction
            (&(this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).testFunction.
              super_ExecFunction);
  (this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).testFunction.super_ExecFunction.
  _vptr_ExecFunction = (_func_int **)&PTR__ExecFunctionWithoutParameters_00370bb0;
  TestTestingFixture::TestTestingFixture
            (&(this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).fixture);
  (this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupSimpleStringInternalCache_003706f0;
  return;
}

Assistant:

TEST(SimpleStringInternalCache, deallocatingMemoryThatWasntAllocatedWhileCacheWasInPlaceProducesWarning)
{
    testFunction.testFunction = deallocatingStringMemoryThatWasntAllocatedWithCache_;
    testFunction.allocationSize = 123;

    cache.setAllocator(allocator);
    fixture.runAllTests();

    fixture.assertPrintContains("\nWARNING: Attempting to deallocate a String buffer that was allocated while not caching. Ignoring it!\n"
                                "This is likely due statics and will cause problems.\n"
                                "Only warning once to avoid recursive warnings.\n"
                                "String we are deallocating: \"Bas\"\n");

}